

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeEnter(Vdbe *p)

{
  Db *pDVar1;
  Btree *p_00;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (p->lockMask != 0) {
    lVar4 = (long)p->db->nDb;
    if (0 < lVar4) {
      pDVar1 = p->db->aDb;
      uVar2 = 1;
      lVar3 = 0;
      do {
        if (((lVar3 != 0x20) && ((p->lockMask & uVar2) != 0)) &&
           (p_00 = *(Btree **)((long)&pDVar1->pBt + lVar3), p_00 != (Btree *)0x0)) {
          sqlite3BtreeEnter(p_00);
        }
        uVar2 = uVar2 * 2;
        lVar3 = lVar3 + 0x20;
      } while (lVar4 * 0x20 != lVar3);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeEnter(Vdbe *p){
  int i;
  yDbMask mask;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  if( p->lockMask==0 ) return;  /* The common case */
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0, mask=1; i<nDb; i++, mask += mask){
    if( i!=1 && (mask & p->lockMask)!=0 && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeEnter(aDb[i].pBt);
    }
  }
}